

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_in_memory.h
# Opt level: O0

void construct_children<std::pair<int,float>>
               (directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_> *current_cell,
               directed_graph_t *graph,
               vector<unsigned_short,_std::allocator<unsigned_short>_> *possible_next_vertices,
               int max_dimension,int current_dimension)

{
  bool bVar1;
  reference puVar2;
  int in_ECX;
  directed_graph_t *in_RDX;
  directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_> *in_RSI;
  unsigned_short *in_RDI;
  int in_R8D;
  directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_> *new_cell;
  unsigned_short v;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *__range2;
  vector<unsigned_short,_std::allocator<unsigned_short>_> new_possible_vertices;
  unsigned_short vertex;
  const_iterator __end1;
  const_iterator __begin1;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *__range1;
  directed_graph_t *in_stack_ffffffffffffff68;
  directed_graph_t *in_stack_ffffffffffffff70;
  value_type_conflict1 *in_stack_ffffffffffffff78;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_stack_ffffffffffffff80;
  __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  local_68 [5];
  unsigned_short local_3a;
  unsigned_short *local_38;
  __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  local_30;
  directed_graph_t *graph_00;
  
  if (in_R8D != in_ECX) {
    graph_00 = in_RDX;
    local_30._M_current =
         (unsigned_short *)
         std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin
                   ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                    in_stack_ffffffffffffff68);
    local_38 = (unsigned_short *)
               std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end
                         ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                          in_stack_ffffffffffffff68);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                               *)in_stack_ffffffffffffff70,
                              (__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                               *)in_stack_ffffffffffffff68), bVar1) {
      puVar2 = __gnu_cxx::
               __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
               ::operator*(&local_30);
      local_3a = *puVar2;
      if (local_3a != *in_RDI) {
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                  ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x1d1a7f);
        local_68[0]._M_current =
             (unsigned_short *)
             std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin
                       ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                        in_stack_ffffffffffffff68);
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end
                  ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                   in_stack_ffffffffffffff68);
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                                   *)in_stack_ffffffffffffff70,
                                  (__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                                   *)in_stack_ffffffffffffff68), bVar1) {
          puVar2 = __gnu_cxx::
                   __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                   ::operator*(local_68);
          if (((*puVar2 != local_3a) && (*puVar2 != *in_RDI)) &&
             (bVar1 = directed_graph_t::is_connected_by_an_edge
                                (in_stack_ffffffffffffff70,
                                 (vertex_index_t)((ulong)in_stack_ffffffffffffff68 >> 0x30),
                                 (vertex_index_t)((ulong)in_stack_ffffffffffffff68 >> 0x20)), bVar1)
             ) {
            std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                      (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
          }
          __gnu_cxx::
          __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
          ::operator++(local_68);
        }
        in_stack_ffffffffffffff68 =
             (directed_graph_t *)
             directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>::add_child
                       (in_RSI,(vertex_index_t)((ulong)graph_00 >> 0x30));
        in_stack_ffffffffffffff70 = in_stack_ffffffffffffff68;
        construct_children<std::pair<int,float>>
                  (in_RSI,graph_00,
                   (vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                   CONCAT44(in_ECX,in_R8D),(int)((ulong)in_RDX >> 0x20),(int)in_RDX);
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
                  (in_stack_ffffffffffffff80);
      }
      __gnu_cxx::
      __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
      ::operator++(&local_30);
    }
  }
  return;
}

Assistant:

void construct_children(directed_flag_complex_cell_in_memory_t<ExtraData>& current_cell, const directed_graph_t& graph,
                        const std::vector<vertex_index_t>& possible_next_vertices, int max_dimension,
                        int current_dimension = 0) {
	if (current_dimension == max_dimension) return;

	for (auto vertex : possible_next_vertices) {
		if (vertex == current_cell.vertex) continue;

		// Compute the next elements
		std::vector<vertex_index_t> new_possible_vertices;
		for (auto v : possible_next_vertices)
			if (v != vertex && v != current_cell.vertex && graph.is_connected_by_an_edge(vertex, v))
				new_possible_vertices.push_back(v);

		directed_flag_complex_cell_in_memory_t<ExtraData>& new_cell = current_cell.add_child(vertex);
		construct_children(new_cell, graph, new_possible_vertices, max_dimension, current_dimension + 1);
	}
}